

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.hpp
# Opt level: O0

bool __thiscall Quad::intersect(Quad *this,Ray *ray,float *result)

{
  float *in_RDX;
  long in_RSI;
  float fVar1;
  point pVar2;
  Ray *unaff_retaddr;
  point p;
  float t;
  undefined4 local_38;
  undefined4 local_30;
  float in_stack_fffffffffffffffc;
  bool bVar3;
  
  fVar1 = -*(float *)(in_RSI + 4) / *(float *)(in_RSI + 0x10);
  pVar2 = Ray::atParam(unaff_retaddr,in_stack_fffffffffffffffc);
  local_38 = pVar2.z;
  if ((((fVar1 <= 0.0) || (local_30 = pVar2.x, local_30 <= -0.5)) || (0.5 <= local_30)) ||
     ((local_38 <= -0.5 || (0.5 <= local_38)))) {
    bVar3 = false;
  }
  else {
    *in_RDX = fVar1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool intersect(const Ray& ray, float& result) const
	{
		float t = -ray.origin.y / ray.dir.y;
		point p = ray.atParam(t);
		if (t>0 && p.x>-0.5 && p.x<0.5 && p.z>-0.5 && p.z<0.5)
		{
			result = t;
			return true;
		}
		return false;
	}